

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

int * __thiscall
dnet::data_types::tensor<int,_1U>::operator[](tensor<int,_1U> *this,array<unsigned_int,_1UL> *i)

{
  value_type_conflict1 vVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  exception *__return_storage_ptr__;
  reference pvVar8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  ulong local_28;
  size_t t;
  array<unsigned_int,_1UL> *paStack_18;
  axes_type ii;
  array<unsigned_int,_1UL> *i_local;
  tensor<int,_1U> *this_local;
  
  local_28 = 0;
  paStack_18 = i;
  while( true ) {
    uVar2 = local_28;
    sVar5 = std::array<unsigned_int,_1UL>::size(paStack_18);
    if (sVar5 <= uVar2) break;
    pvVar6 = std::array<unsigned_int,_1UL>::operator[](paStack_18,local_28);
    vVar1 = *pvVar6;
    pvVar7 = std::array<unsigned_int,_1UL>::operator[](&this->_axes_sort,local_28);
    pvVar7 = std::array<unsigned_int,_1UL>::operator[]
                       ((array<unsigned_int,_1UL> *)((long)&t + 4),(ulong)*pvVar7);
    *pvVar7 = vVar1;
    local_28 = local_28 + 1;
  }
  bVar3 = check(this,paStack_18);
  if (!bVar3) {
    __return_storage_ptr__ = (exception *)__cxa_allocate_exception(0x40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"matrix",&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"Index out of range.",&local_81);
    misc::make_error(__return_storage_ptr__,&local_48,&local_80);
    __cxa_throw(__return_storage_ptr__,&misc::exception::typeinfo,misc::exception::~exception);
  }
  iVar4 = to_index(this,(array<unsigned_int,_1UL> *)((long)&t + 4));
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&this->_data,(long)iVar4);
  return pvVar8;
}

Assistant:

T &tensor<T, N>::operator[](const std::array<index_type, N> &i)
        {
            axes_type ii;
            for (size_t t = 0; t < i.size(); t++)
                ii[this->_axes_sort[t]] = i[t];
            if (!this->check(i)) {
                throw misc::make_error("matrix", "Index out of range.");
            }
            return this->_data[this->to_index(ii)];
        }